

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorts.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  uint64_t uVar2;
  undefined7 uVar3;
  uint uVar4;
  ostream *poVar5;
  result_type rVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  uint uVar10;
  uint64_t *puVar11;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range2;
  pointer pEVar12;
  ulong uVar13;
  Edge *i;
  pointer pEVar14;
  pointer pEVar15;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v1;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> v2;
  default_random_engine e1;
  uniform_int_distribution<unsigned_long> uniform_dist;
  random_device r;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_1438;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_1420;
  value_type local_1408;
  ulong local_13e0;
  long local_13d8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13d0;
  uniform_int_distribution<unsigned_long> local_13c8;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar4 = std::random_device::_M_getval();
  uVar10 = uVar4 / 0x7fffffff << 0x1f | uVar4 / 0x7fffffff;
  local_13d0._M_x = (unsigned_long)(uVar10 + uVar4 + (uint)(uVar4 + uVar10 == 0));
  local_13c8._M_param._M_a = 0;
  local_13c8._M_param._M_b = 0xffffffffffffffff;
  uVar13 = 1;
  while( true ) {
    local_1408.shift = 0;
    local_1408.super_LightEdge.u = 0;
    local_1408.super_LightEdge.v = 0;
    local_1408._16_8_ = local_1408._16_8_ & 0xffffffffffffff00;
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
              (&local_1438,uVar13 * 10000,&local_1408,(allocator_type *)&local_1420);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pEVar12 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pEVar14 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                   super__Vector_impl_data._M_start; pEVar14 != pEVar12; pEVar14 = pEVar14 + 1) {
      rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_13c8,&local_13d0,&local_13c8._M_param);
      pEVar14->shift = rVar6;
    }
    std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector(&local_1420,&local_1438);
    local_13e0 = uVar13;
    lVar7 = std::chrono::_V2::system_clock::now();
    srs::radixSort(&local_1438);
    lVar8 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Radix sort: ",0xc);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar8 - lVar7) / 1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," sec.",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    local_13d8 = std::chrono::_V2::system_clock::now();
    pEVar14 = local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pEVar12 = local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar8 = (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl
                    .super__Vector_impl_data._M_start;
      uVar13 = lVar8 >> 5;
      lVar7 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar8 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pEVar12,pEVar14);
      }
      else {
        pEVar15 = pEVar12 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pEVar12,pEVar15);
        for (; pEVar15 != pEVar14; pEVar15 = pEVar15 + 1) {
          local_1408._16_8_ = *(undefined8 *)&pEVar15->finished;
          local_1408.super_LightEdge.u = (pEVar15->super_LightEdge).u;
          local_1408.super_LightEdge.v = (pEVar15->super_LightEdge).v;
          uVar13 = pEVar15->shift;
          uVar1 = pEVar15[-1].shift;
          pEVar12 = pEVar15;
          while (uVar13 < uVar1) {
            uVar3 = *(undefined7 *)&pEVar12[-1].field_0x11;
            uVar2 = pEVar12[-1].shift;
            pEVar12->finished = pEVar12[-1].finished;
            *(undefined7 *)&pEVar12->field_0x11 = uVar3;
            pEVar12->shift = uVar2;
            uVar2 = pEVar12[-1].super_LightEdge.v;
            (pEVar12->super_LightEdge).u = pEVar12[-1].super_LightEdge.u;
            (pEVar12->super_LightEdge).v = uVar2;
            uVar1 = pEVar12[-2].shift;
            pEVar12 = pEVar12 + -1;
          }
          *(undefined8 *)&pEVar12->finished = local_1408._16_8_;
          (pEVar12->super_LightEdge).u = local_1408.super_LightEdge.u;
          (pEVar12->super_LightEdge).v = local_1408.super_LightEdge.v;
          pEVar12->shift = uVar13;
        }
      }
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"std::sort: ",0xb);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar7 - local_13d8) / 1000000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," sec.",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    plVar9 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    uVar1 = local_13e0;
    if ((long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start) break;
    if (local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar11 = &(local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                  super__Vector_impl_data._M_start)->shift;
      pEVar12 = local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (pEVar12->shift != *puVar11) goto LAB_001026f0;
        pEVar12 = pEVar12 + 1;
        puVar11 = puVar11 + 4;
      } while (pEVar12 !=
               local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1420.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1438.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar13 = uVar1 * 10;
    if (1000 < uVar1) {
      std::random_device::_M_fini();
      return 0;
    }
  }
LAB_001026f0:
  __assert_fail("v1 == v2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rogday[P]SRS/src/tests/sorts.cpp"
                ,0x2c,"int main()");
}

Assistant:

int main() {
    std::random_device r;
    std::default_random_engine e1(r());
    std::uniform_int_distribution<srs::u64> uniform_dist(
        0, std::numeric_limits<srs::u64>::max());

    for (std::uint64_t i = 1; i <= 10'000; i *= 10) {
        std::vector<Graph::Edge> v1(10'000 * i, Graph::Edge(0, 0, false, 0));

        std::cout << v1.size() << std::endl;
        for (auto &i : v1)
            i.shift = uniform_dist(e1);
        std::vector v2(v1);

        auto start = std::chrono::system_clock::now();
        srs::radixSort(v1);
        auto end = std::chrono::system_clock::now();

        std::cout << "Radix sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl;

        start = std::chrono::system_clock::now();
        std::sort(std::begin(v2), std::end(v2),
                  [](const Graph::Edge &e1, const Graph::Edge &e2) {
                      return e1.shift < e2.shift;
                  });
        end = std::chrono::system_clock::now();

        std::cout << "std::sort: "
                  << std::chrono::duration<double>(end - start).count()
                  << " sec." << std::endl
                  << std::endl;

        assert(v1 == v2);
    }
}